

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int byte_sequence_to_str(char *buffer,uint8_t *bytes,uint bytes_len,uint tabstops)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint local_38;
  uint local_34;
  uint j_1;
  uint i;
  uint j;
  uint bytes_printed;
  uint tabstops_local;
  uint bytes_len_local;
  uint8_t *bytes_local;
  char *buffer_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  i = 1;
  bytes_local = (uint8_t *)buffer;
  for (j_1 = 0; j_1 < tabstops; j_1 = j_1 + 1) {
    iVar2 = sprintf((char *)bytes_local,"\t");
    bytes_local = bytes_local + iVar2;
  }
  for (local_34 = 0; local_34 < bytes_len; local_34 = local_34 + 1) {
    iVar2 = sprintf((char *)bytes_local,"%02X ",(ulong)bytes[local_34]);
    bytes_local = bytes_local + iVar2;
    if ((i & 0xf) == 0) {
      iVar2 = sprintf((char *)bytes_local,"\n");
      bytes_local = bytes_local + iVar2;
      for (local_38 = 0; local_38 < tabstops; local_38 = local_38 + 1) {
        iVar2 = sprintf((char *)bytes_local,"\t");
        bytes_local = bytes_local + iVar2;
      }
    }
    i = i + 1;
  }
  if ((bytes_len & 0xf) != 0) {
    iVar2 = sprintf((char *)bytes_local,"\n");
    bytes_local = bytes_local + iVar2;
  }
  sprintf((char *)bytes_local,"\n");
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int byte_sequence_to_str(char *buffer, uint8_t *bytes, unsigned int bytes_len, unsigned int tabstops)
{
	unsigned int bytes_printed = 1;

	for (unsigned int j = 0; j < tabstops; j++)
		buffer += sprintf(buffer, "\t");

	for (unsigned int i = 0; i < bytes_len; i++, bytes_printed++) {
		buffer += sprintf(buffer, "%02X ", bytes[i]);

		/* Only print 16 bytes in a single line. */
		if (bytes_printed % 16 == 0) {
			buffer += sprintf(buffer, "\n");
			for (unsigned int j = 0; j < tabstops; j++)
				buffer += sprintf(buffer, "\t");
		}
	}

	/* If there was no new line printed at the end of the for loop,
	 * print an extra new line.
	 */
	if (bytes_len % 16 != 0)
		buffer += sprintf(buffer, "\n");
	sprintf(buffer, "\n");
	return RTR_BGPSEC_SUCCESS;
}